

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.c
# Opt level: O3

int re_match(re_pattern_buffer *__buffer,char *__string,int __length,int __start,
            re_registers *__regs)

{
  byte bVar1;
  byte bVar2;
  void *pvVar3;
  regoff_t **__src;
  long lVar4;
  uint uVar5;
  int iVar6;
  ushort **ppuVar7;
  undefined4 in_register_0000000c;
  int __length_00;
  undefined4 in_register_00000014;
  long lVar8;
  ulong __n;
  void *in_R9;
  int iVar9;
  byte *__s1;
  ulong uVar10;
  byte *pbVar11;
  bool bVar12;
  bool bVar13;
  re_machine sub_machine;
  re_group_register regs1 [10];
  re_group_register regs2 [10];
  re_registers local_180 [7];
  regoff_t *local_d8 [21];
  
  __s1 = (byte *)CONCAT44(in_register_00000014,__length);
  uVar10 = CONCAT44(in_register_0000000c,__start);
  uVar5 = __regs->num_regs;
  if ((long)(int)uVar5 != -1) {
    lVar8 = (long)(int)uVar5 * 0x20;
    bVar1 = *(byte *)(__buffer->used + 0x18 + lVar8);
    if (((bVar1 & 6) != 0) && (lVar8 = (long)*(char *)(__buffer->used + lVar8), lVar8 < 10)) {
      lVar8 = lVar8 * 0x10;
      lVar4 = lVar8 + 8;
      if ((bVar1 & 2) != 0) {
        lVar4 = lVar8;
      }
      *(byte **)((long)in_R9 + lVar4) = __s1;
    }
  }
  iVar9 = 0;
  if (uVar5 != *(uint *)&__regs->field_0x4) {
    do {
      pbVar11 = (byte *)((long)(int)uVar5 * 0x20 + __buffer->used);
      if (((uVar5 != 0xffffffff) && ((pbVar11[0x18] & 6) != 0)) && ((long)(char)*pbVar11 < 10)) {
        pvVar3 = (void *)((long)in_R9 + 8);
        if ((pbVar11[0x18] & 2) != 0) {
          pvVar3 = in_R9;
        }
        *(byte **)((long)pvVar3 + (long)(char)*pbVar11 * 0x10) = __s1;
      }
      if ((pbVar11[0x18] & 6) != 0) {
switchD_0021a429_caseD_1:
        if (*(int *)(pbVar11 + 8) != -1) {
          memcpy(&local_180[0].start,in_R9,0xa0);
          local_180[0].num_regs = *(uint *)(pbVar11 + 4);
          local_180[0]._4_4_ = *(undefined4 *)&__regs->field_0x4;
          __length_00 = (int)__s1;
          iVar6 = re_match(__buffer,__string,__length_00,(int)uVar10,local_180);
          memcpy(local_d8,in_R9,0xa0);
          local_180[0].num_regs = *(uint *)(pbVar11 + 8);
          local_180[0]._4_4_ = *(undefined4 *)&__regs->field_0x4;
          iVar9 = re_match(__buffer,__string,__length_00,(int)uVar10,local_180);
          if ((iVar6 < 0) && (iVar9 < 0)) {
            return -1;
          }
          __src = local_d8;
          if (iVar9 < iVar6) {
            iVar9 = iVar6;
            __src = &local_180[0].start;
          }
          memcpy(in_R9,__src,0xa0);
          return iVar9 + (__length_00 - __length);
        }
        goto LAB_0021a3fb;
      }
      bVar1 = *pbVar11;
      switch(bVar1) {
      case 1:
        goto switchD_0021a429_caseD_1;
      case 2:
        if (uVar10 == 0) {
          return -1;
        }
        goto LAB_0021a6ab;
      case 3:
        if (__s1 != (byte *)__string) {
          return -1;
        }
        break;
      case 4:
        if (uVar10 != 0) {
          return -1;
        }
        uVar10 = 0;
        break;
      case 5:
        if (__s1 == (byte *)__string) {
          if (uVar10 == 0) {
            return -1;
          }
          ppuVar7 = __ctype_b_loc();
        }
        else {
          bVar1 = __s1[-1];
          ppuVar7 = __ctype_b_loc();
          if ((*(byte *)((long)*ppuVar7 + (ulong)bVar1 * 2 + 1) & 0xc) != 0) {
            return -1;
          }
          if (uVar10 == 0) {
            return -1;
          }
        }
        bVar1 = *__s1;
        goto LAB_0021a6eb;
      case 6:
        if (uVar10 == 0) {
          if (__s1 == (byte *)__string) {
            return -1;
          }
          ppuVar7 = __ctype_b_loc();
        }
        else {
          bVar1 = *__s1;
          ppuVar7 = __ctype_b_loc();
          if (__s1 == (byte *)__string) {
            return -1;
          }
          if (((*ppuVar7)[bVar1] & 0xc00) != 0) {
            return -1;
          }
        }
        bVar1 = __s1[-1];
LAB_0021a6eb:
        if ((*(byte *)((long)*ppuVar7 + (ulong)bVar1 * 2 + 1) & 0xc) == 0) {
          return -1;
        }
        break;
      case 7:
        if (uVar10 == 0) {
          return -1;
        }
        bVar1 = *__s1;
        ppuVar7 = __ctype_b_loc();
        if ((*(byte *)((long)*ppuVar7 + (ulong)bVar1 * 2 + 1) & 0xc) == 0) {
          return -1;
        }
        goto LAB_0021a6ab;
      case 8:
        if (uVar10 == 0) {
          return -1;
        }
        bVar1 = *__s1;
        ppuVar7 = __ctype_b_loc();
        if ((*(byte *)((long)*ppuVar7 + (ulong)bVar1 * 2 + 1) & 0xc) != 0) {
          return -1;
        }
        goto LAB_0021a6ab;
      case 9:
      case 10:
        bVar12 = false;
        if (__s1 != (byte *)__string) {
          bVar2 = __s1[-1];
          ppuVar7 = __ctype_b_loc();
          bVar12 = (*(byte *)((long)*ppuVar7 + (ulong)bVar2 * 2 + 1) & 0xc) != 0;
        }
        bVar13 = false;
        if (uVar10 != 0) {
          bVar2 = *__s1;
          ppuVar7 = __ctype_b_loc();
          bVar13 = (*(byte *)((long)*ppuVar7 + (ulong)bVar2 * 2 + 1) & 0xc) != 0;
        }
        if (bVar1 == 9 && bVar12 == bVar13) {
          return -1;
        }
        if (bVar1 == 10 && bVar12 != bVar13) {
          return -1;
        }
        break;
      case 0xb:
      case 0xc:
        if (uVar10 == 0) {
          return -1;
        }
        bVar12 = (1 << (*__s1 & 7) &
                 (uint)*(byte *)(*(long *)(pbVar11 + 0x10) + (ulong)(*__s1 >> 3))) == 0;
        if (bVar1 == 0xb && bVar12) {
          return -1;
        }
        if (bVar1 == 0xc && !bVar12) {
          return -1;
        }
        goto LAB_0021a6ab;
      case 0xd:
      case 0xe:
      case 0xf:
      case 0x10:
      case 0x11:
      case 0x12:
      case 0x13:
      case 0x14:
      case 0x15:
      case 0x16:
        pvVar3 = *(void **)((long)in_R9 + (ulong)bVar1 * 0x10 + -0xd0);
        if (pvVar3 == (void *)0x0) {
          return -1;
        }
        lVar8 = *(long *)((long)in_R9 + (ulong)bVar1 * 0x10 + -200);
        if (lVar8 == 0) {
          return -1;
        }
        __n = lVar8 - (long)pvVar3;
        bVar12 = uVar10 < __n;
        uVar10 = uVar10 - __n;
        if (bVar12) {
          return -1;
        }
        iVar9 = bcmp(__s1,pvVar3,__n);
        if (iVar9 != 0) {
          return -1;
        }
        __s1 = __s1 + __n;
        break;
      default:
        if (uVar10 == 0) {
          return -1;
        }
        if (bVar1 != *__s1) {
          return -1;
        }
LAB_0021a6ab:
        __s1 = __s1 + 1;
        uVar10 = uVar10 - 1;
      }
LAB_0021a3fb:
      uVar5 = *(uint *)(pbVar11 + 4);
    } while (uVar5 != *(uint *)&__regs->field_0x4);
    if (uVar5 != 0xffffffff) {
      bVar1 = *(byte *)(__buffer->used + 0x18 + (long)(int)uVar5 * 0x20);
      if (((bVar1 & 6) != 0) &&
         (lVar8 = (long)*(char *)(__buffer->used + (long)(int)uVar5 * 0x20), lVar8 < 10)) {
        pvVar3 = (void *)((long)in_R9 + 8);
        if ((bVar1 & 2) != 0) {
          pvVar3 = in_R9;
        }
        *(byte **)((long)pvVar3 + lVar8 * 0x10) = __s1;
      }
    }
    iVar9 = (int)__s1 - __length;
  }
  return iVar9;
}

Assistant:

static int re_match(re_context *ctx, const char *entire_str,
                    const char *str, size_t origlen,
                    const re_machine *machine, re_group_register *regs)
{
    re_state_id cur_state;
    const char *p;
    size_t curlen;

    /* start at the machine's initial state */
    cur_state = machine->init;

    /* start at the beginning of the string */
    p = str;
    curlen = origlen;

    /* note any group involved in the initial state */
    re_note_group(ctx, regs, cur_state, p);

    /* 
     *   if we're starting in the final state, immediately return success
     *   with a zero-length match 
     */
    if (cur_state == machine->final)
    {
        /* return success with a zero-length match */
        return 0;
    }

    /* run the machine */
    for (;;)
    {
        re_tuple *tuple;

        /* get the tuple for this state */
        tuple = &ctx->tuple_arr[cur_state];

        /* if this is a group state, adjust the group registers */
        re_note_group(ctx, regs, cur_state, p);
        
        /* see what kind of state we're in */
        if (!(tuple->flags & (RE_STATE_GROUP_BEGIN | RE_STATE_GROUP_END))
            && tuple->ch != RE_EPSILON)
        {
            /*
             *   This is a character or group recognizer state.  If we
             *   match the character or group, continue on to the next
             *   state; otherwise, return failure.
             */
            switch(tuple->ch)
            {
            case RE_GROUP_MATCH_0:
            case RE_GROUP_MATCH_0 + 1:
            case RE_GROUP_MATCH_0 + 2:
            case RE_GROUP_MATCH_0 + 3:
            case RE_GROUP_MATCH_0 + 4:
            case RE_GROUP_MATCH_0 + 5:
            case RE_GROUP_MATCH_0 + 6:
            case RE_GROUP_MATCH_0 + 7:
            case RE_GROUP_MATCH_0 + 8:
            case RE_GROUP_MATCH_0 + 9:
                {
                    int group_num;
                    re_group_register *group_reg;
                    size_t reg_len;
                    
                    /* it's a group - get the group number */
                    group_num = tuple->ch - RE_GROUP_MATCH_0;
                    group_reg = &regs[group_num];
                    
                    /* 
                     *   if this register isn't defined, there's nothing
                     *   to match, so fail 
                     */
                    if (group_reg->start_ofs == 0 || group_reg->end_ofs == 0)
                        return -1;
                    
                    /* calculate the length of the register value */
                    reg_len = group_reg->end_ofs - group_reg->start_ofs;
                    
                    /* if we don't have enough left to match, it fails */
                    if (curlen < reg_len)
                        return -1;
                    
                    /* if the string doesn't match exactly, we fail */
                    if (memcmp(p, group_reg->start_ofs, reg_len) != 0)
                        return -1;
                    
                    /*
                     *   It matches exactly - skip the entire length of
                     *   the register in the source string 
                     */
                    p += reg_len;
                    curlen -= reg_len;
                }
                break;

            case RE_TEXT_BEGIN:
                /* 
                 *   Match only the exact beginning of the string - if
                 *   we're anywhere else, this isn't a match.  If this
                 *   succeeds, we don't skip any characters.  
                 */
                if (p != entire_str)
                    return -1;
                break;

            case RE_TEXT_END:
                /*
                 *   Match only the exact end of the string - if we're
                 *   anywhere else, this isn't a match.  Don't skip any
                 *   characters on success.  
                 */
                if (curlen != 0)
                    return -1;
                break;

            case RE_WORD_BEGIN:
                /* 
                 *   if the previous character is a word character, we're
                 *   not at the beginning of a word 
                 */
                if (p != entire_str && re_is_word_char(*(p-1)))
                    return -1;

                /* 
                 *   if we're at the end of the string, or the current
                 *   character isn't the start of a word, we're not at the
                 *   beginning of a word 
                 */
                if (curlen == 0 || !re_is_word_char(*p))
                    return -1;
                break;

            case RE_WORD_END:
                /*
                 *   if the current character is a word character, we're not
                 *   at the end of a word 
                 */
                if (curlen != 0 && re_is_word_char(*p))
                    return -1;

                /*
                 *   if we're at the beginning of the string, or the
                 *   previous character is not a word character, we're not
                 *   at the end of a word 
                 */
                if (p == entire_str || !re_is_word_char(*(p-1)))
                    return -1;
                break;

            case RE_WORD_CHAR:
                /* if it's not a word character, it's a failure */
                if (curlen == 0 || !re_is_word_char(*p))
                    return -1;

                /* skip this character of input */
                ++p;
                --curlen;
                break;

            case RE_NON_WORD_CHAR:
                /* if it's a word character, it's a failure */
                if (curlen == 0 || re_is_word_char(*p))
                    return -1;

                /* skip the input */
                ++p;
                --curlen;
                break;

            case RE_WORD_BOUNDARY:
            case RE_NON_WORD_BOUNDARY:
                {
                    int prev_is_word;
                    int next_is_word;
                    int boundary;

                    /*
                     *   Determine if the previous character is a word
                     *   character -- if we're at the beginning of the
                     *   string, it's obviously not, otherwise check its
                     *   classification 
                     */
                    prev_is_word = (p != entire_str
                                    && re_is_word_char(*(p-1)));

                    /* make the same check for the current character */
                    next_is_word = (curlen != 0
                                    && re_is_word_char(*p));

                    /*
                     *   Determine if this is a boundary - it is if the
                     *   two states are different 
                     */
                    boundary = ((prev_is_word != 0) ^ (next_is_word != 0));

                    /* 
                     *   make sure it matches what was desired, and return
                     *   failure if not 
                     */
                    if ((tuple->ch == RE_WORD_BOUNDARY && !boundary)
                        || (tuple->ch == RE_NON_WORD_BOUNDARY && boundary))
                        return -1;
                }
                break;

            case RE_WILDCARD:
                /* make sure we have a character to match */
                if (curlen == 0)
                    return -1;

                /* skip this character */
                ++p;
                --curlen;
                break;

            case RE_RANGE:
            case RE_RANGE_EXCL:
                {
                    int match;
                    
                    /* make sure we have a character to match */
                    if (curlen == 0)
                        return -1;
                    
                    /* see if we match */
                    match = re_is_bit_set(tuple->char_range,
                                          (int)(unsigned char)*p);
                    
                    /* make sure we got what we wanted */
                    if ((tuple->ch == RE_RANGE && !match)
                        || (tuple->ch == RE_RANGE_EXCL && match))
                        return -1;

                    /* skip this character of the input */
                    ++p;
                    --curlen;
                }
                break;

            default:
                /* make sure we have an exact match */
                if (curlen == 0 || tuple->ch != *p)
                    return -1;

                /* skip this character of the input */
                ++p;
                --curlen;
                break;
            }

            /* 
             *   if we got this far, we were successful - move on to the
             *   next state 
             */
            cur_state = tuple->next_state_1;
        }
        else if (tuple->next_state_2 == RE_STATE_INVALID)
        {
            /*
             *   We have only one transition, so this state is entirely
             *   deterministic.  Simply move on to the next state. 
             */
            cur_state = tuple->next_state_1;
        }
        else
        {
            re_machine sub_machine;
            re_group_register regs1[RE_GROUP_REG_CNT];
            re_group_register regs2[RE_GROUP_REG_CNT];
            int ret1;
            int ret2;
            
            /*
             *   This state has two possible transitions, and we don't
             *   know which one to take.  So, try both, see which one
             *   works better, and return the result.  Try the first
             *   transition first.  Note that each separate attempt must
             *   use a separate copy of the registers.  
             */
            memcpy(regs1, regs, sizeof(regs1));
            sub_machine.init = tuple->next_state_1;
            sub_machine.final = machine->final;
            ret1 = re_match(ctx, entire_str, p, curlen, &sub_machine, regs1);

            /*
             *   Now try the second transition 
             */
            memcpy(regs2, regs, sizeof(regs2));
            sub_machine.init = tuple->next_state_2;
            sub_machine.final = machine->final;
            ret2 = re_match(ctx, entire_str, p, curlen, &sub_machine, regs2);

            /*
             *   If they both failed, the whole thing failed.  Otherwise,
             *   return the longer of the two, plus the length we
             *   ourselves matched previously.  Note that we return the
             *   register set from the winning match.  
             */
            if (ret1 < 0 && ret2 < 0)
            {
                /* they both failed */
                return -1;
            }
            else if (ret1 > ret2)
            {
                /* use the first register set and result length */
                memcpy(regs, regs1, sizeof(regs1));
                return ret1 + (p - str);
            }
            else
            {
                /* use the second register set and result length */
                memcpy(regs, regs2, sizeof(regs2));
                return ret2 + (p - str);
            }
        }

        /*
         *   If we're in the final state, return success 
         */
        if (cur_state == machine->final)
        {
            /* finish off any group involved in the final state */
            re_note_group(ctx, regs, cur_state, p);
            
            /* return the length we matched */
            return p - str;
        }
    }
}